

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability.h
# Opt level: O0

void aligned_free(void *memblock)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    free(in_RDI);
  }
  return;
}

Assistant:

static inline void aligned_free(void *memblock) {
    if(memblock == nullptr) { return; }
#ifdef _MSC_VER
    _aligned_free(memblock);
#elif defined(__MINGW32__) || defined(__MINGW64__)
    __mingw_aligned_free(memblock);
#else
    free(memblock);
#endif
}